

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCof.c
# Opt level: O3

DdNode * Cudd_Cofactor(DdManager *dd,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  
  if (((DdNode *)((ulong)dd->one ^ 1) == g) || (dd->zero == g)) {
    fwrite("Cudd_Cofactor: Invalid restriction 1\n",0x25,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INVALID_ARG;
    pDVar1 = (DdNode *)0x0;
  }
  else {
    do {
      dd->reordered = 0;
      pDVar1 = cuddCofactorRecur(dd,f,g);
    } while (dd->reordered == 1);
  }
  return pDVar1;
}

Assistant:

DdNode *
Cudd_Cofactor(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *res,*zero;

    zero = Cudd_Not(DD_ONE(dd));
    if (g == zero || g == DD_ZERO(dd)) {
        (void) fprintf(dd->err,"Cudd_Cofactor: Invalid restriction 1\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }
    do {
        dd->reordered = 0;
        res = cuddCofactorRecur(dd,f,g);
    } while (dd->reordered == 1);
    return(res);

}